

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_register_iolib(HSQUIRRELVM v)

{
  HSQUIRRELVM v_00;
  HSQUIRRELVM in_RDI;
  SQRegFunction *unaff_retaddr;
  SQInteger top;
  HSQUIRRELVM in_stack_00000018;
  HSQUIRRELVM in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQBool in_stack_ffffffffffffffe8;
  
  v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
  declare_stream(in_stack_00000028,(SQChar *)in_stack_00000020,in_stack_00000018,(SQChar *)v,
                 (SQRegFunction *)top,unaff_retaddr);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sqstd_createfile(in_RDI,v_00,in_stack_ffffffffffffffe8);
  sq_newslot(in_stack_00000018,(SQInteger)v,top);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sqstd_createfile(in_RDI,v_00,in_stack_ffffffffffffffe8);
  sq_newslot(in_stack_00000018,(SQInteger)v,top);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sqstd_createfile(in_RDI,v_00,in_stack_ffffffffffffffe8);
  sq_newslot(in_stack_00000018,(SQInteger)v,top);
  sq_settop(v_00,in_stack_ffffffffffffffe8);
  return 0;
}

Assistant:

SQRESULT sqstd_register_iolib(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    //create delegate
    declare_stream(v,_SC("file"),(SQUserPointer)SQSTD_FILE_TYPE_TAG,_SC("std_file"),_file_methods,iolib_funcs);
    sq_pushstring(v,_SC("stdout"),-1);
    sqstd_createfile(v,stdout,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("stdin"),-1);
    sqstd_createfile(v,stdin,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("stderr"),-1);
    sqstd_createfile(v,stderr,SQFalse);
    sq_newslot(v,-3,SQFalse);
    sq_settop(v,top);
    return SQ_OK;
}